

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall JobQueue::clearQueue(JobQueue *this,int jobCount,int jobSize)

{
  lockQueue(this);
  this->m_tailIndex = 0;
  this->m_headIndex = 0;
  this->m_allocSize = 0;
  this->m_queueIsEmpty = true;
  if (this->m_jobMemSize < jobSize * jobCount) {
    resizeJobMem(this,jobSize * jobCount);
  }
  if ((this->m_jobQueue).m_capacity < jobCount) {
    cbtAlignedObjectArray<IJob_*>::reserve(&this->m_jobQueue,jobCount);
  }
  unlockQueue(this);
  cbtAlignedObjectArray<IJob_*>::resizeNoInitialize(&this->m_jobQueue,0);
  return;
}

Assistant:

void clearQueue(int jobCount, int jobSize)
	{
		lockQueue();
		m_headIndex = 0;
		m_tailIndex = 0;
		m_allocSize = 0;
		m_queueIsEmpty = true;
		int jobBufSize = jobSize * jobCount;
		// make sure we have enough memory allocated to store jobs
		if (jobBufSize > m_jobMemSize)
		{
			resizeJobMem(jobBufSize);
		}
		// make sure job queue is big enough
		if (jobCount > m_jobQueue.capacity())
		{
			m_jobQueue.reserve(jobCount);
		}
		unlockQueue();
		m_jobQueue.resizeNoInitialize(0);
	}